

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQInteger __thiscall SQFuncState::GetConstant(SQFuncState *this,SQObject *cons)

{
  SQUnsignedInteger *pSVar1;
  SQTable *pSVar2;
  SQObjectValue SVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  SQObjectPtr val;
  SQObjectPtr local_40;
  SQObjectPtr local_30;
  
  local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_40.super_SQObject._type = OT_NULL;
  pSVar2 = (this->_literals).super_SQObject._unVal.pTable;
  local_30.super_SQObject._type = cons->_type;
  local_30.super_SQObject._unVal = (SQObjectValue)(cons->_unVal).pTable;
  if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  bVar6 = SQTable::Get(pSVar2,&local_30,&local_40);
  SQObjectPtr::~SQObjectPtr(&local_30);
  if (!bVar6) {
    SVar3 = (SQObjectValue)this->_nliterals;
    if ((local_40.super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    local_40.super_SQObject._type = OT_INTEGER;
    pSVar2 = (this->_literals).super_SQObject._unVal.pTable;
    local_30.super_SQObject._type = cons->_type;
    local_30.super_SQObject._unVal = (SQObjectValue)(cons->_unVal).pTable;
    if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    local_40.super_SQObject._unVal = SVar3;
    SQTable::NewSlot(pSVar2,&local_30,&local_40);
    SQObjectPtr::~SQObjectPtr(&local_30);
    SVar3 = local_40.super_SQObject._unVal;
    lVar4 = this->_nliterals;
    this->_nliterals = lVar4 + 1;
    if (0x7ffffffe < lVar4) {
      uVar5 = local_40.super_SQObject._type >> 0x1b;
      local_40.super_SQObject._type = OT_NULL;
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      if ((uVar5 & 1) != 0) {
        pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
            _vptr_SQRefCounted[2])();
        }
      }
      (*this->_errfunc)(this->_errtarget,"internal compiler error: too many literals");
    }
  }
  SVar3 = local_40.super_SQObject._unVal;
  SQObjectPtr::~SQObjectPtr(&local_40);
  return (SQInteger)SVar3.pTable;
}

Assistant:

SQInteger SQFuncState::GetConstant(const SQObject &cons)
{
    SQObjectPtr val;
    if(!_table(_literals)->Get(cons,val))
    {
        val = _nliterals;
        _table(_literals)->NewSlot(cons,val);
        _nliterals++;
        if(_nliterals > MAX_LITERALS) {
            val.Null();
            Error(_SC("internal compiler error: too many literals"));
        }
    }
    return _integer(val);
}